

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  mbedtls_mpi_uint *pmVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong *puVar6;
  ulong *puVar7;
  size_t nblimbs;
  
  nblimbs = ((buflen >> 3) + 1) - (ulong)((buflen & 7) == 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
    iVar5 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  iVar5 = mbedtls_mpi_grow(X,1);
  if (iVar5 == 0) {
    memset(X->p,0,X->n << 3);
    pmVar1 = X->p;
    *pmVar1 = 0;
    X->s = 1;
    iVar5 = 0;
    if (buf != (uchar *)0x0) {
      memcpy((void *)((long)pmVar1 + (nblimbs * 8 - buflen)),buf,buflen);
      puVar2 = X->p;
      puVar7 = puVar2 + (nblimbs - 1);
      if (puVar2 <= puVar7 && nblimbs != 0) {
        do {
          puVar6 = puVar2 + 1;
          uVar3 = *puVar2;
          uVar4 = *puVar7;
          *puVar2 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                    (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                    (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                    (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
          *puVar7 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                    (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                    (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                    (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
          puVar7 = puVar7 + -1;
          iVar5 = 0;
          puVar2 = puVar6;
        } while (puVar6 <= puVar7);
      }
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t const limbs    = CHARS_TO_LIMBS( buflen );
    size_t const overhead = ( limbs * ciL ) - buflen;
    unsigned char *Xp;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( buflen == 0 || buf != NULL );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    /* Avoid calling `memcpy` with NULL source argument,
     * even if buflen is 0. */
    if( buf != NULL )
    {
        Xp = (unsigned char*) X->p;
        memcpy( Xp + overhead, buf, buflen );

        mpi_bigendian_to_host( X->p, limbs );
    }

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return( ret );
}